

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::insert_child_after(xml_node *this,xml_node_type type_,xml_node *node)

{
  bool bVar1;
  xml_node_type parent;
  xml_node_struct *p;
  xml_node local_38;
  xml_node n;
  xml_allocator *alloc;
  xml_node *node_local;
  xml_node_type type__local;
  xml_node *this_local;
  
  parent = type(this);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,type_);
  if (bVar1) {
    if ((node->_root == (xml_node_struct *)0x0) || (node->_root->parent != this->_root)) {
      xml_node((xml_node *)&this_local);
    }
    else {
      n._root = (xml_node_struct *)
                impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)n._root);
      if (bVar1) {
        p = impl::anon_unknown_0::allocate_node(n._root,type_);
        xml_node(&local_38,p);
        bVar1 = operator!(&local_38);
        if (bVar1) {
          xml_node((xml_node *)&this_local);
        }
        else {
          impl::anon_unknown_0::insert_node_after(local_38._root,node->_root);
          if (type_ == node_declaration) {
            set_name(&local_38,"xml");
          }
          this_local = (xml_node *)local_38._root;
        }
      }
      else {
        xml_node((xml_node *)&this_local);
      }
    }
  }
  else {
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::insert_child_after(xml_node_type type_, const xml_node& node)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_after(n._root, node._root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}